

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void windowIfNewPeer(Parse *pParse,ExprList *pOrderBy,int regNew,int regOld,int addr)

{
  Op *pOVar1;
  Vdbe *p;
  KeyInfo *p4;
  int iVar2;
  int iVar3;
  
  p = sqlite3GetVdbe(pParse);
  if (pOrderBy == (ExprList *)0x0) {
    iVar2 = 0xb;
    regNew = 0;
    iVar3 = 0;
    regOld = addr;
  }
  else {
    iVar3 = pOrderBy->nExpr;
    p4 = sqlite3KeyInfoFromExprList(pParse,pOrderBy,0,0);
    sqlite3VdbeAddOp3(p,0x57,regOld,regNew,iVar3);
    if (p->db->mallocFailed == '\0') {
      pOVar1 = p->aOp;
      iVar2 = p->nOp;
      pOVar1[(long)iVar2 + -1].p4type = -9;
      pOVar1[(long)iVar2 + -1].p4.pKeyInfo = p4;
    }
    else {
      freeP4(p->db,-9,p4);
    }
    iVar2 = p->nOp + 1;
    sqlite3VdbeAddOp3(p,0x10,iVar2,addr,iVar2);
    iVar3 = iVar3 + -1;
    iVar2 = 0x4e;
  }
  sqlite3VdbeAddOp3(p,iVar2,regNew,regOld,iVar3);
  return;
}

Assistant:

static void windowIfNewPeer(
  Parse *pParse,
  ExprList *pOrderBy,
  int regNew,                     /* First in array of new values */
  int regOld,                     /* First in array of old values */
  int addr                        /* Jump here */
){
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( pOrderBy ){
    int nVal = pOrderBy->nExpr;
    KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pOrderBy, 0, 0);
    sqlite3VdbeAddOp3(v, OP_Compare, regOld, regNew, nVal);
    sqlite3VdbeAppendP4(v, (void*)pKeyInfo, P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump, 
      sqlite3VdbeCurrentAddr(v)+1, addr, sqlite3VdbeCurrentAddr(v)+1
    );
    VdbeCoverageEqNe(v);
    sqlite3VdbeAddOp3(v, OP_Copy, regNew, regOld, nVal-1);
  }else{
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
  }
}